

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FieldGenerator::SetHasBitIndex
          (FieldGenerator *this,int32_t has_bit_index)

{
  char *buffer;
  FieldDescriptor FVar1;
  FieldDescriptor *pFVar2;
  LogMessage *other;
  char *pcVar3;
  mapped_type *pmVar4;
  int iVar5;
  ulong uVar6;
  Hex hex;
  Hex hex_00;
  _Alloc_hider in_stack_fffffffffffffe98;
  _Alloc_hider _Var7;
  undefined1 local_158 [16];
  string local_148;
  LogMessage local_128;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  pFVar2 = this->descriptor_;
  FVar1 = pFVar2[1];
  if (((byte)FVar1 & 2) == 0) {
    if ((((byte)FVar1 & 0x60) == 0x20) && (*(char *)(*(long *)(pFVar2 + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar1 & 0x10) != 0) && (*(long *)(pFVar2 + 0x28) != 0)) goto LAB_002e070a;
    }
    else if (((byte)FVar1 & 0x60) != 0x40) goto LAB_002e070a;
  }
  if (*(char *)(*(long *)(pFVar2 + 0x38) + 0x4f) != '\x01') {
    local_128._0_8_ = "_has_bits_[";
    iVar5 = has_bit_index + 0x1f;
    if (-1 < has_bit_index) {
      iVar5 = has_bit_index;
    }
    local_128.filename_ = (char *)0xb;
    buffer = local_f0.digits;
    local_f0.piece_data_ = buffer;
    pcVar3 = FastInt32ToBufferLeft(iVar5 >> 5,buffer);
    local_f0.piece_size_ = (long)pcVar3 - (long)buffer;
    local_60.piece_data_ = "] |= 0x";
    local_60.piece_size_ = 7;
    uVar6 = (ulong)(uint)(1 << ((byte)has_bit_index & 0x1f));
    hex._8_8_ = 8;
    hex.value = uVar6;
    strings::AlphaNum::AlphaNum(&local_90,hex);
    local_c0.piece_data_ = "u;";
    local_c0.piece_size_ = 2;
    StrCat_abi_cxx11_(&local_148,(protobuf *)&local_128,&local_f0,&local_60,&local_90,&local_c0,
                      (AlphaNum *)in_stack_fffffffffffffe98._M_p);
    _Var7._M_p = (pointer)local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe98,"set_hasbit","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,(key_type *)&stack0xfffffffffffffe98);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_148);
    if ((AlphaNum *)_Var7._M_p != (AlphaNum *)local_158) {
      operator_delete(_Var7._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    local_128._0_8_ = "_has_bits_[";
    local_128.filename_ = (char *)0xb;
    local_f0.piece_data_ = buffer;
    pcVar3 = FastInt32ToBufferLeft(iVar5 >> 5,buffer);
    local_f0.piece_size_ = (long)pcVar3 - (long)buffer;
    local_60.piece_data_ = "] &= ~0x";
    local_60.piece_size_ = 8;
    hex_00._8_8_ = 8;
    hex_00.value = uVar6;
    strings::AlphaNum::AlphaNum(&local_90,hex_00);
    local_c0.piece_data_ = "u;";
    local_c0.piece_size_ = 2;
    StrCat_abi_cxx11_(&local_148,(protobuf *)&local_128,&local_f0,&local_60,&local_90,&local_c0,
                      (AlphaNum *)_Var7._M_p);
    _Var7._M_p = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe98,"clear_hasbit","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,(key_type *)&stack0xfffffffffffffe98);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_148);
    if (_Var7._M_p != local_158) {
      operator_delete(_Var7._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) {
      return;
    }
    operator_delete(local_148._M_dataplus._M_p);
    return;
  }
LAB_002e070a:
  if (has_bit_index != -1) {
    internal::LogMessage::LogMessage
              (&local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x112);
    other = internal::LogMessage::operator<<(&local_128,"CHECK failed: (has_bit_index) == (-1): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_f0,other);
    internal::LogMessage::~LogMessage(&local_128);
  }
  return;
}

Assistant:

void FieldGenerator::SetHasBitIndex(int32_t has_bit_index) {
  if (!HasHasbit(descriptor_)) {
    GOOGLE_CHECK_EQ(has_bit_index, -1);
    return;
  }
  variables_["set_hasbit"] = StrCat(
      "_has_bits_[", has_bit_index / 32, "] |= 0x",
      strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8), "u;");
  variables_["clear_hasbit"] = StrCat(
      "_has_bits_[", has_bit_index / 32, "] &= ~0x",
      strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8), "u;");
}